

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int MRIStepEvolve(void *arkode_mem,realtype tout,N_Vector yout,realtype *tret,int itask)

{
  int *nflagPtr;
  long lVar1;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  realtype rVar11;
  double dVar12;
  undefined8 uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int iStack_58;
  int iStack_54;
  realtype rStack_50;
  realtype rStack_48;
  int aiStack_40 [4];
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","MRIStepEvolve",
                    "arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (arkode_mem == (void *)0x0) {
    pcVar9 = "arkode_mem = NULL illegal.";
    iVar3 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    iVar7 = -0x15;
  }
  else if (*(int *)((long)arkode_mem + 0x250) == 0) {
    pcVar9 = "Attempt to call before ARKodeInit.";
    iVar3 = -0x17;
    iVar7 = -0x17;
  }
  else {
    *(N_Vector *)((long)arkode_mem + 0x108) = yout;
    if (yout == (N_Vector)0x0) {
      pcVar9 = "yout = NULL illegal.";
    }
    else if (tret == (realtype *)0x0) {
      pcVar9 = "tret = NULL illegal.";
    }
    else {
      if (0xfffffffd < itask - 3U) {
        lVar6 = *(long *)((long)arkode_mem + 0x280);
        if (lVar6 != 0) {
          if (itask == 1) {
            *(realtype *)(lVar6 + 0x50) = tout;
          }
          *(int *)(lVar6 + 0x60) = itask;
        }
        rStack_50 = tout;
        if (*(int *)((long)arkode_mem + 0x254) != 0) {
          rVar11 = *(realtype *)((long)arkode_mem + 0x198);
          *tret = rVar11;
          *(realtype *)((long)arkode_mem + 0x1a0) = rVar11;
          iStack_58 = arkInitialSetup((ARKodeMem)arkode_mem,tout);
          if (iStack_58 != 0) {
            return iStack_58;
          }
        }
        if ((*(int *)((long)arkode_mem + 0x254) == 0) &&
           (iVar3 = arkStopTests((ARKodeMem)arkode_mem,rStack_50,yout,tret,itask,&iStack_58),
           iVar3 != 0)) {
          return iStack_58;
        }
        nflagPtr = aiStack_40 + 3;
        lVar6 = 0;
        iStack_54 = iStack_58;
        do {
          *(undefined8 *)((long)arkode_mem + 0x188) = *(undefined8 *)((long)arkode_mem + 0x168);
          if (*(int *)((long)arkode_mem + 0x254) == 0) {
            iVar3 = (**(code **)((long)arkode_mem + 0x58))
                              (*(undefined8 *)((long)arkode_mem + 0x110),
                               *(undefined8 *)((long)arkode_mem + 0xf0),
                               *(undefined8 *)((long)arkode_mem + 0x60));
            if (iVar3 == 0) {
              if ((*(int *)((long)arkode_mem + 0x100) != 0) ||
                 (iVar3 = (**(code **)((long)arkode_mem + 0x70))
                                    (*(undefined8 *)((long)arkode_mem + 0x110),
                                     *(undefined8 *)((long)arkode_mem + 0xf8),
                                     *(undefined8 *)((long)arkode_mem + 0x78)), iVar3 == 0))
              goto LAB_004f9e8c;
              iVar3 = *(int *)((long)arkode_mem + 0x18);
              uVar13 = *(undefined8 *)((long)arkode_mem + 0x198);
              pcVar4 = "At t = %lg, the user-provide RwtSet function failed.";
              pcVar9 = "At t = %lg, a component of rwt has become <= 0.";
            }
            else {
              iVar3 = *(int *)((long)arkode_mem + 0x18);
              uVar13 = *(undefined8 *)((long)arkode_mem + 0x198);
              pcVar4 = "At t = %lg, the user-provide EwtSet function failed.";
              pcVar9 = "At t = %lg, a component of ewt has become <= 0.";
            }
            if (iVar3 == 2) {
              pcVar9 = pcVar4;
            }
            iVar3 = -0x16;
            iVar7 = -0x16;
LAB_004fa5d3:
            iStack_58 = iStack_54;
            arkProcessError((ARKodeMem)arkode_mem,iVar7,"ARKode","arkEvolve",pcVar9,uVar13);
LAB_004fa5da:
            rVar11 = *(realtype *)((long)arkode_mem + 0x198);
            *tret = rVar11;
            *(realtype *)((long)arkode_mem + 0x1a0) = rVar11;
            N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),yout);
            return iVar3;
          }
LAB_004f9e8c:
          if (*(long *)((long)arkode_mem + 0x1b8) <= lVar6 &&
              0 < *(long *)((long)arkode_mem + 0x1b8)) {
            uVar13 = *(undefined8 *)((long)arkode_mem + 0x198);
            pcVar9 = "At t = %lg, mxstep steps taken before reaching tout.";
            iVar3 = -1;
            iVar7 = -1;
            goto LAB_004fa5d3;
          }
          rVar11 = N_VWrmsNorm(*(N_Vector *)((long)arkode_mem + 0x110),
                               *(N_Vector *)((long)arkode_mem + 0xf0));
          dVar12 = rVar11 * *(double *)((long)arkode_mem + 8);
          *(double *)((long)arkode_mem + 0x240) = dVar12;
          if (1.0 < dVar12) {
            iStack_58 = iStack_54;
            arkProcessError((ARKodeMem)arkode_mem,-2,"ARKode","arkEvolve",
                            "At t = %lg, too much accuracy requested.",
                            *(undefined8 *)((long)arkode_mem + 0x198));
            rVar11 = *(realtype *)((long)arkode_mem + 0x198);
            *tret = rVar11;
            *(realtype *)((long)arkode_mem + 0x1a0) = rVar11;
            N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),yout);
            *(double *)((long)arkode_mem + 0x240) =
                 *(double *)((long)arkode_mem + 0x240) + *(double *)((long)arkode_mem + 0x240);
            return -2;
          }
          *(undefined8 *)((long)arkode_mem + 0x240) = 0x3ff0000000000000;
          dVar12 = *(double *)((long)arkode_mem + 0x198);
          dVar14 = dVar12 + *(double *)((long)arkode_mem + 0x168);
          if ((dVar14 == dVar12) && (!NAN(dVar14) && !NAN(dVar12))) {
            iVar3 = *(int *)((long)arkode_mem + 0x1e0);
            *(int *)((long)arkode_mem + 0x1e0) = iVar3 + 1;
            if (iVar3 < *(int *)((long)arkode_mem + 0x1c0)) {
              arkProcessError((ARKodeMem)arkode_mem,99,"ARKode","arkEvolve",
                              "Internal t = %lg and h = %lg are such that t + h = t on the next step. The solver will continue anyway."
                             );
            }
            if (*(int *)((long)arkode_mem + 0x1e0) == *(int *)((long)arkode_mem + 0x1c0)) {
              arkProcessError((ARKodeMem)arkode_mem,99,"ARKode","arkEvolve",
                              "The above warning has been issued mxhnil times and will not be issued again for this problem."
                             );
            }
          }
          dVar12 = *(double *)((long)arkode_mem + 0x168);
          if ((*(double *)((long)arkode_mem + 0x180) != dVar12) ||
             (NAN(*(double *)((long)arkode_mem + 0x180)) || NAN(dVar12))) {
            dVar12 = dVar12 * *(double *)((long)arkode_mem + 400);
            *(double *)((long)arkode_mem + 0x168) = dVar12;
            *(double *)((long)arkode_mem + 0x188) = dVar12;
          }
          if (*(int *)((long)arkode_mem + 0x1a8) != 0) {
            dVar12 = *(double *)((long)arkode_mem + 0x160);
            *(double *)((long)arkode_mem + 0x168) = dVar12;
            *(double *)((long)arkode_mem + 0x188) = dVar12;
            if (*(int *)((long)arkode_mem + 0x150) != 0) {
              if (0.0 < ((dVar12 + *(double *)((long)arkode_mem + 0x198)) -
                        *(double *)((long)arkode_mem + 0x158)) * dVar12) {
                *(double *)((long)arkode_mem + 0x168) =
                     (*(double *)((long)arkode_mem + 8) * -4.0 + 1.0) *
                     (*(double *)((long)arkode_mem + 0x158) - *(double *)((long)arkode_mem + 0x198))
                ;
              }
            }
          }
          rStack_48 = 0.0;
          *(undefined4 *)((long)arkode_mem + 0x2a4) = 0;
          aiStack_40[0] = 0;
          aiStack_40[1] = 0;
          aiStack_40[2] = 0;
          aiStack_40[3] = 6;
          while( true ) {
            *(long *)((long)arkode_mem + 0x1d0) = *(long *)((long)arkode_mem + 0x1d0) + 1;
            iVar3 = (**(code **)((long)arkode_mem + 0xe0))(arkode_mem,&rStack_48,nflagPtr);
            if (iVar3 < 0) break;
            iVar3 = arkCheckConvergence((ARKodeMem)arkode_mem,nflagPtr,aiStack_40 + 2);
            if ((iVar3 < 0) ||
               (((iVar3 == 0 && (*(int *)((long)arkode_mem + 0x80) != 0)) &&
                (iVar3 = arkCheckConstraints((ARKodeMem)arkode_mem,aiStack_40,nflagPtr), iVar3 < 0))
               )) break;
            if (*(int *)((long)arkode_mem + 0x1a8) != 0) {
              *(undefined8 *)((long)arkode_mem + 400) = 0x3ff0000000000000;
              break;
            }
            if ((iVar3 == 0) &&
               (iVar3 = arkCheckTemporalError
                                  ((ARKodeMem)arkode_mem,nflagPtr,aiStack_40 + 1,rStack_48),
               iVar3 < 0)) break;
            dVar12 = *(double *)((long)arkode_mem + 400);
            if (**(double **)((long)arkode_mem + 0x1b0) <= *(double *)((long)arkode_mem + 400)) {
              dVar12 = **(double **)((long)arkode_mem + 0x1b0);
            }
            dVar14 = ABS(*(double *)((long)arkode_mem + 0x168));
            dVar15 = *(double *)((long)arkode_mem + 0x170) / dVar14;
            if (dVar12 <= dVar15) {
              dVar12 = dVar15;
            }
            dVar16 = *(double *)((long)arkode_mem + 0x178) * dVar14 * dVar12;
            dVar15 = 1.0;
            if (1.0 <= dVar16) {
              dVar15 = dVar16;
            }
            *(double *)((long)arkode_mem + 400) = dVar12 / dVar15;
            if (*(int *)((long)arkode_mem + 0x2a0) != 0) {
              *(int *)((long)arkode_mem + 0x2a4) = iVar3;
LAB_004fa187:
              iVar3 = 0;
              break;
            }
            if (iVar3 == 0) goto LAB_004fa187;
            if (dVar14 <= *(double *)((long)arkode_mem + 0x170) * 1.000001) {
              return -3;
            }
            dVar12 = *(double *)((long)arkode_mem + 0x168) * (dVar12 / dVar15);
            *(double *)((long)arkode_mem + 0x168) = dVar12;
            *(double *)((long)arkode_mem + 0x180) = dVar12;
            *(double *)((long)arkode_mem + 0x188) = dVar12;
          }
          if (iVar3 == 0) {
            iVar3 = arkCompleteStep((ARKodeMem)arkode_mem,rStack_48);
          }
          if (iVar3 != 0) {
            iStack_58 = iStack_54;
            iVar3 = arkHandleFailure((ARKodeMem)arkode_mem,iVar3);
            goto LAB_004fa5da;
          }
          if ((*(long *)((long)arkode_mem + 0x280) != 0) &&
             (0 < *(int *)(*(long *)((long)arkode_mem + 0x280) + 8))) {
            iVar3 = arkRootCheck3(arkode_mem);
            if (iVar3 == -0xc) {
              iStack_58 = iVar3;
              arkProcessError((ARKodeMem)arkode_mem,-0xc,"ARKode","arkEvolve",
                              "At t = %lg, the rootfinding routine failed in an unrecoverable manner."
                              ,*(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x20));
              return -0xc;
            }
            if (iVar3 == 1) {
              lVar6 = *(long *)((long)arkode_mem + 0x280);
              *(undefined4 *)(lVar6 + 100) = 1;
              rVar11 = *(realtype *)(lVar6 + 0x20);
              *tret = rVar11;
              *(realtype *)((long)arkode_mem + 0x1a0) = rVar11;
              return 2;
            }
            iStack_54 = iVar3;
            if (*(long *)((long)arkode_mem + 0x1d8) == 1) {
              lVar1 = *(long *)((long)arkode_mem + 0x280);
              uVar5 = (ulong)*(int *)(lVar1 + 8);
              bVar10 = 0 < (long)uVar5;
              if ((0 < (long)uVar5) && (**(int **)(lVar1 + 0x70) != 0)) {
                uVar2 = 1;
                do {
                  uVar8 = uVar2;
                  if (uVar5 == uVar8) break;
                  uVar2 = uVar8 + 1;
                } while ((*(int **)(lVar1 + 0x70))[uVar8] != 0);
                bVar10 = uVar8 < uVar5;
              }
              if ((bVar10) && (0 < *(int *)(lVar1 + 0x78))) {
                arkProcessError((ARKodeMem)arkode_mem,99,"ARKode","arkEvolve",
                                "At the end of the first step, there are still some root functions identically 0. This warning will not be issued again."
                               );
              }
            }
          }
          if ((itask == 1) &&
             (0.0 <= (*(double *)((long)arkode_mem + 0x198) - rStack_50) *
                     *(double *)((long)arkode_mem + 0x168))) {
            iStack_58 = iStack_54;
            *tret = rStack_50;
            *(realtype *)((long)arkode_mem + 0x1a0) = rStack_50;
            arkGetDky((ARKodeMem)arkode_mem,rStack_50,0,yout);
            *(undefined8 *)((long)arkode_mem + 0x188) = *(undefined8 *)((long)arkode_mem + 0x180);
            return 0;
          }
          if (*(int *)((long)arkode_mem + 0x150) != 0) {
            dVar12 = *(double *)((long)arkode_mem + 0x158);
            dVar14 = *(double *)((long)arkode_mem + 0x198);
            dVar15 = *(double *)((long)arkode_mem + 0x168);
            if (ABS(dVar14 - dVar12) <=
                (ABS(dVar15) + ABS(dVar14)) * *(double *)((long)arkode_mem + 8) * 100.0) {
              iStack_58 = iStack_54;
              arkGetDky((ARKodeMem)arkode_mem,dVar12,0,yout);
              rVar11 = *(realtype *)((long)arkode_mem + 0x158);
              *tret = rVar11;
              *(realtype *)((long)arkode_mem + 0x1a0) = rVar11;
              *(undefined4 *)((long)arkode_mem + 0x150) = 0;
              return 1;
            }
            if (0.0 < ((*(double *)((long)arkode_mem + 0x180) + dVar14) - dVar12) * dVar15) {
              dVar12 = (*(double *)((long)arkode_mem + 8) * -4.0 + 1.0) * (dVar12 - dVar14);
              *(double *)((long)arkode_mem + 0x180) = dVar12;
              *(double *)((long)arkode_mem + 400) = dVar12 / dVar15;
            }
          }
          lVar6 = lVar6 + 1;
          if (itask == 2) {
            iStack_58 = iStack_54;
            rVar11 = *(realtype *)((long)arkode_mem + 0x198);
            *tret = rVar11;
            *(realtype *)((long)arkode_mem + 0x1a0) = rVar11;
            N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),yout);
            *(undefined8 *)((long)arkode_mem + 0x188) = *(undefined8 *)((long)arkode_mem + 0x180);
            return 0;
          }
        } while( true );
      }
      pcVar9 = "Illegal value for itask.";
    }
    iVar3 = -0x16;
    iVar7 = -0x16;
  }
  arkProcessError((ARKodeMem)arkode_mem,iVar7,"ARKode","arkEvolve",pcVar9);
  return iVar3;
}

Assistant:

int MRIStepEvolve(void *arkode_mem, realtype tout, N_Vector yout,
                  realtype *tret, int itask)
{
  /* unpack ark_mem, call arkEvolve, and return */
  int retval;
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepEvolve", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  SUNDIALS_MARK_FUNCTION_BEGIN(ARK_PROFILER);
  retval = arkEvolve(ark_mem, tout, yout, tret, itask);
  SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
  return(retval);
}